

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::PoissonRegressionLoss::dim_forward
          (Dim *__return_storage_ptr__,PoissonRegressionLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  invalid_argument *this_00;
  ulong uVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  int iVar19;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 == 0x24) {
    if ((ulong)pDVar1->nd == 0) {
      iVar19 = 1;
    }
    else {
      auVar13 = vpbroadcastq_avx512f();
      auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar10 = 0;
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar17 = vmovdqa64_avx512f(auVar14);
        auVar14 = vpbroadcastq_avx512f();
        auVar18 = vporq_avx512f(auVar14,auVar15);
        auVar14 = vporq_avx512f(auVar14,auVar16);
        uVar5 = vpcmpuq_avx512f(auVar14,auVar13,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar18,auVar13,2);
        bVar7 = (byte)uVar5;
        uVar11 = CONCAT11(bVar7,bVar6);
        auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar10));
        auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
        auVar18._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_;
        auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
        auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
        auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
        auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
        auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
        auVar18._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
        auVar18._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_;
        auVar18._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar14._36_4_;
        auVar18._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar14._40_4_;
        auVar18._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar14._44_4_;
        auVar18._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar14._48_4_;
        auVar18._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar14._52_4_;
        auVar18._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar14._56_4_;
        auVar18._60_4_ = (uint)(bVar7 >> 7) * auVar14._60_4_;
        auVar14 = vpmulld_avx512f(auVar18,auVar17);
        uVar10 = uVar10 + 0x10;
      } while (((ulong)pDVar1->nd + 0xf & 0xfffffffffffffff0) != uVar10);
      auVar13 = vmovdqa32_avx512f(auVar14);
      auVar14._0_4_ = (uint)(bVar6 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar17._0_4_;
      bVar2 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar14._4_4_ = (uint)bVar2 * auVar13._4_4_ | (uint)!bVar2 * auVar17._4_4_;
      bVar2 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar14._8_4_ = (uint)bVar2 * auVar13._8_4_ | (uint)!bVar2 * auVar17._8_4_;
      bVar2 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar14._12_4_ = (uint)bVar2 * auVar13._12_4_ | (uint)!bVar2 * auVar17._12_4_;
      bVar2 = (bool)((byte)(uVar11 >> 4) & 1);
      auVar14._16_4_ = (uint)bVar2 * auVar13._16_4_ | (uint)!bVar2 * auVar17._16_4_;
      bVar2 = (bool)((byte)(uVar11 >> 5) & 1);
      auVar14._20_4_ = (uint)bVar2 * auVar13._20_4_ | (uint)!bVar2 * auVar17._20_4_;
      bVar2 = (bool)((byte)(uVar11 >> 6) & 1);
      auVar14._24_4_ = (uint)bVar2 * auVar13._24_4_ | (uint)!bVar2 * auVar17._24_4_;
      bVar2 = (bool)((byte)(uVar11 >> 7) & 1);
      auVar14._28_4_ = (uint)bVar2 * auVar13._28_4_ | (uint)!bVar2 * auVar17._28_4_;
      auVar14._32_4_ =
           (uint)(bVar7 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar14._36_4_ = (uint)bVar2 * auVar13._36_4_ | (uint)!bVar2 * auVar17._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar14._40_4_ = (uint)bVar2 * auVar13._40_4_ | (uint)!bVar2 * auVar17._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar14._44_4_ = (uint)bVar2 * auVar13._44_4_ | (uint)!bVar2 * auVar17._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar14._48_4_ = (uint)bVar2 * auVar13._48_4_ | (uint)!bVar2 * auVar17._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar14._52_4_ = (uint)bVar2 * auVar13._52_4_ | (uint)!bVar2 * auVar17._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar14._56_4_ = (uint)bVar2 * auVar13._56_4_ | (uint)!bVar2 * auVar17._56_4_;
      auVar14._60_4_ =
           (uint)(bVar7 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar17._60_4_;
      auVar12 = vextracti64x4_avx512f(auVar14,1);
      auVar13 = vpmulld_avx512f(auVar14,ZEXT3264(auVar12));
      auVar3 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      iVar19 = auVar3._0_4_;
    }
    if (iVar19 * pDVar1->bd == 1) {
      __return_storage_ptr__->bd = pDVar1->bd;
      uVar5 = *(undefined8 *)(pDVar1->d + 2);
      uVar8 = *(undefined8 *)(pDVar1->d + 4);
      uVar9 = *(undefined8 *)(pDVar1->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar5;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar8;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar9;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in PoissonRegressionLoss: ",0x2f);
  operator<<((ostream *)local_190,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PoissonRegressionLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].size() != 1) {
    ostringstream s; s << "Bad input dimensions in PoissonRegressionLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0];
}